

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.cpp
# Opt level: O0

string * StringTools::urlEncode
                   (string *__return_storage_ptr__,string *value,string *additionalLegitChars)

{
  bool bVar1;
  _Setfill<char> _Var2;
  int iVar3;
  _Setw _Var4;
  byte *pbVar5;
  long lVar6;
  ostream *poVar7;
  undefined8 uVar8;
  void *this;
  char *c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  stringstream ss;
  ostream local_1b0 [399];
  allocator local_21;
  string *local_20;
  string *additionalLegitChars_local;
  string *value_local;
  
  local_20 = additionalLegitChars;
  additionalLegitChars_local = value;
  value_local = __return_storage_ptr__;
  if (urlEncode(std::__cxx11::string_const&,std::__cxx11::string_const&)::
      legitPunctuation_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&urlEncode(std::__cxx11::string_const&,std::__cxx11::string_const&)
                                 ::legitPunctuation_abi_cxx11_);
    if (iVar3 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)
                 &urlEncode(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                  legitPunctuation_abi_cxx11_,
                 "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789_.-~:",&local_21);
      std::allocator<char>::~allocator((allocator<char> *)&local_21);
      __cxa_atexit(std::__cxx11::string::~string,
                   &urlEncode(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                    legitPunctuation_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&urlEncode(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                           legitPunctuation_abi_cxx11_);
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&__range1);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  c = (char *)std::__cxx11::string::end();
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&c);
    if (!bVar1) {
      std::__cxx11::stringstream::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)&__range1);
      return __return_storage_ptr__;
    }
    pbVar5 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&__end1);
    lVar6 = std::__cxx11::string::find('@',(ulong)(uint)(int)(char)*pbVar5);
    if (lVar6 == -1) {
      lVar6 = std::__cxx11::string::find((char)local_20,(ulong)(uint)(int)(char)*pbVar5);
      if (lVar6 != -1) goto LAB_003cf34a;
      poVar7 = std::operator<<(local_1b0,'%');
      uVar8 = std::ostream::operator<<(poVar7,std::uppercase);
      _Var2 = std::setfill<char>('0');
      poVar7 = std::operator<<(uVar8,_Var2._M_c);
      _Var4 = std::setw(2);
      poVar7 = std::operator<<(poVar7,_Var4);
      this = (void *)std::ostream::operator<<(poVar7,std::hex);
      std::ostream::operator<<(this,(uint)*pbVar5);
    }
    else {
LAB_003cf34a:
      std::operator<<(local_1b0,*pbVar5);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

string urlEncode(const string& value, const std::string& additionalLegitChars) {
    static const string legitPunctuation = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789_.-~:";
    std::stringstream ss;
    for (auto const &c : value) {
        if ((legitPunctuation.find(c) == std::string::npos) && (additionalLegitChars.find(c) == std::string::npos)) {
            ss << '%' << std::uppercase << std::setfill('0') << std::setw(2) << std::hex << (unsigned int)(unsigned char)c;
        } else {
            ss << c;
        }
    }

    return ss.str();
}